

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O0

void __thiscall QFunctionJAOHTree::DeInitialize(QFunctionJAOHTree *this)

{
  long in_RDI;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *unaff_retaddr;
  
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::clear(unaff_retaddr);
  *(undefined1 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void QFunctionJAOHTree::DeInitialize()
{
    _m_QValues.clear();
    _m_initialized=false;
}